

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.cpp
# Opt level: O2

bool __thiscall TimeStampReq::Decode(TimeStampReq *this,uchar *pIn,size_t cbIn,size_t *cbUsed)

{
  size_t *cbUsed_00;
  long lVar1;
  size_t sVar2;
  bool bVar3;
  DecodeResult DVar4;
  size_t sVar5;
  byte bVar6;
  undefined1 auStack_58 [8];
  SequenceHelper sh;
  
  sh.prefixSize = 0;
  auStack_58 = (undefined1  [8])0x0;
  sh.dataSize = 0;
  sh.cbUsed._0_1_ = 0;
  sh.cbCurrent = (size_t)cbUsed;
  DVar4 = SequenceHelper::Init((SequenceHelper *)auStack_58,pIn,cbIn,&(this->super_DerBase).cbData);
  sVar2 = sh.dataSize;
  if (DVar4 < Success) {
    bVar6 = 6 >> ((byte)DVar4 & 7);
  }
  else {
    lVar1 = *(long *)sh.cbCurrent;
    sVar5 = SequenceHelper::DataSize((SequenceHelper *)auStack_58);
    cbUsed_00 = &sh.prefixSize;
    bVar3 = Integer::Decode(&this->version,pIn + sVar2 + lVar1,sVar5,cbUsed_00);
    sVar2 = sh.dataSize;
    if (bVar3) {
      *(size_t *)sh.cbCurrent = *(long *)sh.cbCurrent + sh.prefixSize;
      sh.prefixSize = 0;
      lVar1 = *(long *)sh.cbCurrent;
      sVar5 = SequenceHelper::DataSize((SequenceHelper *)auStack_58);
      bVar3 = MessageImprint::Decode(&this->messageImprint,pIn + sVar2 + lVar1,sVar5,cbUsed_00);
      sVar2 = sh.dataSize;
      if (bVar3) {
        *(size_t *)sh.cbCurrent = *(long *)sh.cbCurrent + sh.prefixSize;
        sh.prefixSize = 0;
        lVar1 = *(long *)sh.cbCurrent;
        sVar5 = SequenceHelper::DataSize((SequenceHelper *)auStack_58);
        bVar3 = ObjectIdentifier::Decode(&this->reqPolicy,pIn + sVar2 + lVar1,sVar5,cbUsed_00);
        sVar2 = sh.dataSize;
        if (bVar3) {
          *(size_t *)sh.cbCurrent = *(long *)sh.cbCurrent + sh.prefixSize;
          sh.prefixSize = 0;
          lVar1 = *(long *)sh.cbCurrent;
          sVar5 = SequenceHelper::DataSize((SequenceHelper *)auStack_58);
          bVar3 = Integer::Decode(&this->nonce,pIn + sVar2 + lVar1,sVar5,cbUsed_00);
          sVar2 = sh.dataSize;
          if (bVar3) {
            *(size_t *)sh.cbCurrent = *(long *)sh.cbCurrent + sh.prefixSize;
            sh.prefixSize = 0;
            lVar1 = *(long *)sh.cbCurrent;
            sVar5 = SequenceHelper::DataSize((SequenceHelper *)auStack_58);
            bVar3 = Boolean::Decode(&this->certReq,pIn + sVar2 + lVar1,sVar5,cbUsed_00);
            sVar2 = sh.dataSize;
            if (bVar3) {
              *(size_t *)sh.cbCurrent = *(long *)sh.cbCurrent + sh.prefixSize;
              sh.prefixSize = 0;
              lVar1 = *(long *)sh.cbCurrent;
              sVar5 = SequenceHelper::DataSize((SequenceHelper *)auStack_58);
              bVar6 = Extensions::Decode(&this->extensions,pIn + sVar2 + lVar1,sVar5,cbUsed_00);
              goto LAB_0011c31a;
            }
          }
        }
      }
    }
    bVar6 = 0;
  }
LAB_0011c31a:
  SequenceHelper::~SequenceHelper((SequenceHelper *)auStack_58);
  return (bool)(bVar6 & 1);
}

Assistant:

bool TimeStampReq::Decode(const unsigned char * pIn, size_t cbIn, size_t & cbUsed)
{
    SequenceHelper sh(cbUsed);

    switch (sh.Init(pIn, cbIn, this->cbData))
    {
    case DecodeResult::Failed:
        return false;
    case DecodeResult::Null:
    case DecodeResult::EmptySequence:
        return true;
    case DecodeResult::Success:
        break;
    }

    if (!version.Decode(sh.DataPtr(pIn), sh.DataSize(), sh.CurrentSize()))
        return false;

    sh.Update();
    if (!messageImprint.Decode(sh.DataPtr(pIn), sh.DataSize(), sh.CurrentSize()))
        return false;

    sh.Update();
    if (!reqPolicy.Decode(sh.DataPtr(pIn), sh.DataSize(), sh.CurrentSize()))
        return false;

    sh.Update();
    if (!nonce.Decode(sh.DataPtr(pIn), sh.DataSize(), sh.CurrentSize()))
        return false;

    sh.Update();
    if (!certReq.Decode(sh.DataPtr(pIn), sh.DataSize(), sh.CurrentSize()))
        return false;

    sh.Update();
    if (!extensions.Decode(sh.DataPtr(pIn), sh.DataSize(), sh.CurrentSize()))
        return false;

    return true;
}